

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QGesture*,QPointer<QWidget>>::emplaceValue<QPointer<QWidget>const&>
          (Node<QGesture*,QPointer<QWidget>> *this,QPointer<QWidget> *args)

{
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d = (args->wp).d;
  local_20.value = (args->wp).value;
  if (local_20.d != (Data *)0x0) {
    LOCK();
    *(int *)local_20.d = *(int *)local_20.d + 1;
    UNLOCK();
  }
  QWeakPointer<QObject>::operator=((QWeakPointer<QObject> *)(this + 8),&local_20);
  QWeakPointer<QObject>::~QWeakPointer(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }